

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O3

int llhttp__internal__c_mul_add_content_length
              (llhttp__internal_t *state,uchar *p,uchar *endp,int match)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = 1;
  if (state->content_length >> 0x3c == 0) {
    uVar3 = state->content_length * 0x10;
    state->content_length = uVar3;
    if (match < 0) {
      uVar2 = (ulong)match;
      if (uVar3 < -uVar2) {
        return 1;
      }
    }
    else {
      if ((ulong)(long)~match < uVar3) {
        return 1;
      }
      uVar2 = (ulong)(uint)match;
    }
    state->content_length = uVar3 + uVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int llhttp__internal__c_mul_add_content_length(
    llhttp__internal_t* state,
    const unsigned char* p,
    const unsigned char* endp,
    int match) {
  /* Multiplication overflow */
  if (state->content_length > 0xffffffffffffffffULL / 16) {
    return 1;
  }
  
  state->content_length *= 16;
  
  /* Addition overflow */
  if (match >= 0) {
    if (state->content_length > 0xffffffffffffffffULL - match) {
      return 1;
    }
  } else {
    if (state->content_length < 0ULL - match) {
      return 1;
    }
  }
  state->content_length += match;
  return 0;
}